

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_constants_block(ModuleParseContext *this,BlockOrRecord *entry)

{
  bool bVar1;
  reference entry_00;
  BlockOrRecord *child;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<BlockOrRecord> *__range1;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  this->constant_type = (Type *)0x0;
  __end1 = std::
           vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
           begin(&entry->children);
  child = (BlockOrRecord *)
          std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
          ::end(&entry->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                                *)&child);
    if (!bVar1) {
      return true;
    }
    entry_00 = __gnu_cxx::
               __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
               ::operator*(&__end1);
    bVar1 = parse_constants_record(this,entry_00);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool ModuleParseContext::parse_constants_block(const BlockOrRecord &entry)
{
	constant_type = nullptr;
	for (auto &child : entry.children)
		if (!parse_constants_record(child))
			return false;
	return true;
}